

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

ostream * operator<<(ostream *stream,Token *token)

{
  ulong uVar1;
  ostream *poVar2;
  anon_class_8_1_54a39813 local_18;
  
  uVar1 = (ulong)token->type;
  if (uVar1 < 0x2e) {
    if ((0x39f000000000U >> (uVar1 & 0x3f) & 1) == 0) {
      if (uVar1 == 0x29) {
        poVar2 = std::operator<<(stream,"Token ");
        local_18.s = poVar2;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ottomated[P]reqlang/Token.cpp:13:16)_&&,_const_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
          ::_S_vtable._M_arr
          [*(__index_type *)
            ((long)&(token->value).
                    super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                    .
                    super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                    .
                    super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                    .
                    super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                    .
                    super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                    .
                    super__Variant_storage_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
            + 0x20)]._M_data)(&local_18,&token->value);
        poVar2 = operator<<(poVar2,&token->type);
        return poVar2;
      }
      if (uVar1 != 0x2a) goto LAB_00105eb3;
      poVar2 = std::operator<<(stream,"Token ");
      poVar2 = operator<<(poVar2,&token->type);
    }
    else {
      poVar2 = std::operator<<(stream,"Token ");
      poVar2 = operator<<(poVar2,&token->type);
      poVar2 = std::operator<<(poVar2,"=");
    }
    local_18.s = poVar2;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ottomated[P]reqlang/Token.cpp:13:16)_&&,_const_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
      ::_S_vtable._M_arr
      [*(__index_type *)
        ((long)&(token->value).
                super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                .super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                .super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                .super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
                super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
                super__Variant_storage_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
        + 0x20)]._M_data)(&local_18,&token->value);
    return poVar2;
  }
LAB_00105eb3:
  poVar2 = std::operator<<(stream,"Token ");
  poVar2 = operator<<(poVar2,&token->type);
  return poVar2;
}

Assistant:

std::ostream &operator<<(std::ostream &stream, const Token &token) {
    if (token.type == Number || token.type == String || token.type == Boolean ||
        token.type == Char || token.type == Name || token.type == Method || token.type == HeaderKey ||
        token.type == HeaderValue)
        return stream << "Token " << token.type << "=" << token.value;
    else if (token.type == HeaderOpener)
        return stream << "Token " << token.value << token.type;
    else if (token.type == HeaderCloser)
        return stream << "Token " << token.type << token.value;
    else
        return stream << "Token " << token.type;

}